

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::JsonValueWriter::writeImpl<unsigned_int,void>
          (JsonValueWriter *this,uint *value,bool quote_value)

{
  StringRef *this_00;
  uint *in_RSI;
  long in_RDI;
  string *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffffaf;
  JsonValueWriter *in_stack_ffffffffffffffb0;
  StringRef in_stack_ffffffffffffffb8;
  
  this_00 = (StringRef *)(in_RDI + 8);
  std::ostream::operator<<((void *)(in_RDI + 0x18),*in_RSI);
  std::__cxx11::stringstream::str();
  StringRef::StringRef(this_00,in_stack_ffffffffffffff88);
  writeImpl(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffaf);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void writeImpl( T const& value, bool quote_value ) {
            m_sstream << value;
            writeImpl( m_sstream.str(), quote_value );
        }